

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall chaiscript::detail::Dispatch_Engine::pop_scope(Dispatch_Engine *this)

{
  Stack_Holder *t_holder;
  Dispatch_Engine *this_local;
  
  t_holder = threading::Thread_Storage<chaiscript::detail::Stack_Holder>::operator*
                       (&this->m_stack_holder);
  pop_scope(t_holder);
  return;
}

Assistant:

void pop_scope() { pop_scope(*m_stack_holder); }